

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ValidateEnumTest_GenerateEnumDataSequential_Test::
TestBody(ValidateEnumTest_GenerateEnumDataSequential_Test *this)

{
  size_type in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__;
  char *pcVar1;
  Span<const_int> values;
  Span<const_int> values_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  AssertHelper local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  AssertHelper local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_30;
  undefined8 local_28;
  char local_18 [8];
  
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\x04';
  local_18[7] = '\0';
  local_48.data_ = (AssertHelperData *)&DAT_100000000;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000002;
  __return_storage_ptr__ = &local_60;
  values.len_ = in_RCX;
  values.ptr_ = (pointer)&DAT_00000004;
  GenerateEnumData(__return_storage_ptr__,(internal *)&local_48,values);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_int,unsigned_int>>>
  ::operator()(&local_38,local_18,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               "GenerateEnumData({0, 1, 2, 3})");
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (pbStack_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (pbStack_30->_M_dataplus)._M_p;
    }
    __return_storage_ptr__ = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xd4;
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util_test.cc"
               ,0xd4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_30,pbStack_30);
  }
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = -2;
  local_18[5] = -1;
  local_18[6] = '\x06';
  local_18[7] = '\0';
  local_38.data_ = (AssertHelperData *)0xfffffffffffffffe;
  pbStack_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000000;
  local_28 = 0x300000002;
  values_00.len_ = (size_type)__return_storage_ptr__;
  values_00.ptr_ = (pointer)&DAT_00000006;
  GenerateEnumData(&local_60,(internal *)&local_38,values_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_int,unsigned_int>>>
  ::operator()(&local_48,local_18,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               "GenerateEnumData({-2, -1, 0, 1, 2, 3})");
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (pbStack_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util_test.cc"
               ,0xda,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_40,pbStack_40);
  }
  return;
}

Assistant:

TEST(ValidateEnumTest, GenerateEnumDataSequential) {
  EXPECT_THAT(GenerateEnumData({0, 1, 2, 3}), ElementsAre(
                                                  // sequence start=0, length=4
                                                  Make32(0, 4),
                                                  // no bitmap, no fallback.
                                                  Make32(0, 0)));
  EXPECT_THAT(GenerateEnumData({-2, -1, 0, 1, 2, 3}),
              ElementsAre(
                  // sequence start=-2, length=6
                  Make32(-2, 6),
                  // no bitmap, no fallback.
                  Make32(0, 0)));
}